

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3ExprTermOffsetInit(Fts3Expr *pExpr,int iPhrase,void *ctx)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long *plVar4;
  long in_RDX;
  long in_RDI;
  TermOffset *pT;
  int rc;
  int iPos;
  char *pList;
  int iTerm;
  int nTerm;
  TermOffsetCtx *p;
  undefined4 in_stack_00000038;
  int *in_stack_ffffffffffffffb8;
  char **in_stack_ffffffffffffffc0;
  long local_30;
  int local_28;
  
  iVar3 = sqlite3Fts3EvalPhrasePoslist
                    ((Fts3Cursor *)CONCAT44(iPhrase,in_stack_00000038),(Fts3Expr *)ctx,p._4_4_,
                     _iTerm);
  iVar1 = *(int *)(*(long *)(in_RDI + 0x20) + 0x50);
  if (local_30 != 0) {
    fts3GetDeltaPosition(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  for (local_28 = 0; local_28 < iVar1; local_28 = local_28 + 1) {
    iVar2 = *(int *)(in_RDX + 0xc);
    *(int *)(in_RDX + 0xc) = iVar2 + 1;
    plVar4 = (long *)(*(long *)(in_RDX + 0x18) + (long)iVar2 * 0x10);
    *(int *)((long)plVar4 + 0xc) = (iVar1 - local_28) + -1;
    *plVar4 = local_30;
    *(undefined4 *)(plVar4 + 1) = 0;
  }
  return iVar3;
}

Assistant:

static int fts3ExprTermOffsetInit(Fts3Expr *pExpr, int iPhrase, void *ctx){
  TermOffsetCtx *p = (TermOffsetCtx *)ctx;
  int nTerm;                      /* Number of tokens in phrase */
  int iTerm;                      /* For looping through nTerm phrase terms */
  char *pList;                    /* Pointer to position list for phrase */
  int iPos = 0;                   /* First position in position-list */
  int rc;

  UNUSED_PARAMETER(iPhrase);
  rc = sqlite3Fts3EvalPhrasePoslist(p->pCsr, pExpr, p->iCol, &pList);
  nTerm = pExpr->pPhrase->nToken;
  if( pList ){
    fts3GetDeltaPosition(&pList, &iPos);
    assert( iPos>=0 );
  }

  for(iTerm=0; iTerm<nTerm; iTerm++){
    TermOffset *pT = &p->aTerm[p->iTerm++];
    pT->iOff = nTerm-iTerm-1;
    pT->pList = pList;
    pT->iPos = iPos;
  }

  return rc;
}